

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autowah.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_11e109::AutowahState::deviceUpdate(AutowahState *this,ALCdevice *param_1)

{
  long lVar1;
  float *pfVar2;
  long lVar3;
  
  this->mAttackRate = 1.0;
  this->mReleaseRate = 1.0;
  this->mResonanceGain = 10.0;
  this->mPeakGain = 4.5;
  this->mFreqMinNorm = 0.00045;
  this->mBandwidthNorm = 0.05;
  this->mEnvDelay = 0.0;
  for (lVar1 = 0; lVar1 != 0x2000; lVar1 = lVar1 + 8) {
    *(undefined8 *)((long)&this->mEnv[0].cos_w0 + lVar1) = 0;
  }
  pfVar2 = this->mChans[0].CurrentGains;
  for (lVar1 = 0x203c; lVar1 != 0x28bc; lVar1 = lVar1 + 0x88) {
    for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 4) {
      *(undefined4 *)((long)pfVar2 + lVar3) = 0;
    }
    *(undefined8 *)((long)this->mEnv + lVar1 + -0x3c) = 0;
    pfVar2 = pfVar2 + 0x22;
  }
  return;
}

Assistant:

void AutowahState::deviceUpdate(const ALCdevice*)
{
    /* (Re-)initializing parameters and clear the buffers. */

    mAttackRate    = 1.0f;
    mReleaseRate   = 1.0f;
    mResonanceGain = 10.0f;
    mPeakGain      = 4.5f;
    mFreqMinNorm   = 4.5e-4f;
    mBandwidthNorm = 0.05f;
    mEnvDelay      = 0.0f;

    for(auto &e : mEnv)
    {
        e.cos_w0 = 0.0f;
        e.alpha = 0.0f;
    }

    for(auto &chan : mChans)
    {
        std::fill(std::begin(chan.CurrentGains), std::end(chan.CurrentGains), 0.0f);
        chan.Filter.z1 = 0.0f;
        chan.Filter.z2 = 0.0f;
    }
}